

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

int google::protobuf::descriptor_unittest::
    AllowUnknownDependenciesTest_UndeclaredDependencyTriggersBuildOfDependency_Test::AddToRegistry
              (void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>
  *this_01;
  TestMetaFactoryBase<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  *meta_factory;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"AllowUnknownDependenciesTest","");
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,"");
  paVar2 = &local_58.file.field_2;
  if (local_e0 == &local_d0) {
    local_58.file.field_2._8_8_ = local_d0._8_8_;
    local_58.file._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_e0;
  }
  local_58.file.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
  local_58.file.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
  local_58.file._M_string_length = local_d8;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_58.line = 0xec0;
  local_e0 = &local_d0;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>
                      (this_00,&local_a0,&local_58);
  meta_factory = (TestMetaFactoryBase<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_018e2410;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,"");
  paVar1 = &local_80.file.field_2;
  if (local_c0 == &local_b0) {
    local_80.file.field_2._8_8_ = local_b0._8_8_;
    local_80.file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_80.file.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_80.file.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_80.file._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_80.line = 0xec0;
  local_c0 = &local_b0;
  testing::internal::
  ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>::
  AddTestPattern(this_01,"AllowUnknownDependenciesTest",
                 "UndeclaredDependencyTriggersBuildOfDependency",meta_factory,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.file._M_dataplus._M_p,local_80.file.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest,
       UndeclaredDependencyTriggersBuildOfDependency) {
  // Crazy case: suppose foo.proto refers to a symbol without declaring the
  // dependency that finds it. In the event that the pool is backed by a
  // DescriptorDatabase, the pool will attempt to find the symbol in the
  // database. If successful, it will build the undeclared dependency to verify
  // that the file does indeed contain the symbol. If that file fails to build,
  // then its descriptors must be rolled back. However, we still want foo.proto
  // to build successfully, since we are allowing unknown dependencies.

  FileDescriptorProto undeclared_dep_proto;
  // We make this file fail to build by giving it two fields with tag 1.
  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: \"invalid_file_as_undeclared_dep.proto\" "
      "package: \"undeclared\" "
      "message_type: {  "
      "  name: \"Mooo\"  "
      "  field { "
      "    name:'moo' number:1 label:LABEL_OPTIONAL type: TYPE_INT32 "
      "  }"
      "  field { "
      "    name:'mooo' number:1 label:LABEL_OPTIONAL type: TYPE_INT64 "
      "  }"
      "}",
      &undeclared_dep_proto));
  // We can't use the BuildFile() helper because we don't actually want to build
  // it into the descriptor pool in the fallback database case: it just needs to
  // be sitting in the database so that it gets built during the building of
  // test.proto below.
  switch (mode()) {
    case NO_DATABASE: {
      ASSERT_TRUE(pool_->BuildFile(undeclared_dep_proto) == nullptr);
      break;
    }
    case FALLBACK_DATABASE: {
      ASSERT_TRUE(db_.Add(undeclared_dep_proto));
    }
  }

  FileDescriptorProto test_proto;
  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: \"test.proto\" "
      "message_type: { "
      "  name: \"Corge\" "
      "  field { "
      "    name:'mooo' number:1 label: LABEL_OPTIONAL "
      "    type_name:'undeclared.Mooo' type: TYPE_MESSAGE "
      "  }"
      "}",
      &test_proto));

  const FileDescriptor* file = BuildFile(test_proto);
  ASSERT_TRUE(file != nullptr);
  ABSL_LOG(INFO) << file->DebugString();

  EXPECT_EQ(0, file->dependency_count());
  ASSERT_EQ(1, file->message_type_count());
  const Descriptor* corge_desc = file->message_type(0);
  ASSERT_EQ("Corge", corge_desc->name());
  ASSERT_EQ(1, corge_desc->field_count());
  EXPECT_FALSE(corge_desc->is_placeholder());

  const FieldDescriptor* mooo_field = corge_desc->field(0);
  ASSERT_EQ(FieldDescriptor::TYPE_MESSAGE, mooo_field->type());
  ASSERT_EQ("Mooo", mooo_field->message_type()->name());
  ASSERT_EQ("undeclared.Mooo", mooo_field->message_type()->full_name());
  EXPECT_TRUE(mooo_field->message_type()->is_placeholder());
  // The place holder type should not be findable.
  ASSERT_TRUE(pool_->FindMessageTypeByName("undeclared.Mooo") == nullptr);
}